

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O2

vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_> * __thiscall
cfd::core::JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct>::ConvertToStruct
          (vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>
           *__return_storage_ptr__,
          JsonObjectVector<cfd::api::json::PsbtGlobalXpub,_PsbtGlobalXpubStruct> *this)

{
  pointer pPVar1;
  pointer this_00;
  PsbtGlobalXpubStruct data;
  PsbtGlobalXpubStruct local_120;
  
  (__return_storage_ptr__->
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pPVar1 = (this->super_JsonVector<cfd::api::json::PsbtGlobalXpub>).
           super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
           .
           super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (this_00 = (this->super_JsonVector<cfd::api::json::PsbtGlobalXpub>).
                 super_vector<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
                 .
                 super__Vector_base<cfd::api::json::PsbtGlobalXpub,_std::allocator<cfd::api::json::PsbtGlobalXpub>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_00 != pPVar1; this_00 = this_00 + 1
      ) {
    cfd::api::json::PsbtGlobalXpub::ConvertToStruct(&local_120,this_00);
    ::std::vector<PsbtGlobalXpubStruct,_std::allocator<PsbtGlobalXpubStruct>_>::push_back
              (__return_storage_ptr__,&local_120);
    PsbtGlobalXpubStruct::~PsbtGlobalXpubStruct(&local_120);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }